

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

double __thiscall Util::RandomDouble(Util *this)

{
  double dVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 extraout_var [56];
  
  auVar2._0_8_ = std::
                 generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                           (&this->rng_);
  auVar2._8_56_ = extraout_var;
  dVar1 = (this->random_double_)._M_param._M_a;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar1;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (this->random_double_)._M_param._M_b - dVar1;
  auVar3 = vfmadd213sd_fma(auVar2._0_16_,auVar4,auVar3);
  return auVar3._0_8_;
}

Assistant:

double Util::RandomDouble() {
    return random_double_(rng_);
}